

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O3

void ndn_pit_unregister_face(ndn_pit_t *self,ndn_table_id_t face_id)

{
  ndn_table_id_t id;
  byte bVar1;
  ulong uVar2;
  nametree_entry_t *pnVar3;
  ndn_nametree_t *pnVar4;
  ulong uVar5;
  ndn_pit_t *pnVar6;
  
  uVar2 = (ulong)self->capacity;
  if (self->capacity != 0) {
    bVar1 = (byte)face_id & 0x3f;
    pnVar6 = self + 2;
    uVar5 = 0;
    do {
      id = pnVar6[3].capacity;
      pnVar4 = (ndn_nametree_t *)
               ((ulong)pnVar6->nametree & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1));
      pnVar6->nametree = pnVar4;
      if (((pnVar4 == (ndn_nametree_t *)0x0 && id != 0xffff) &&
          (pnVar6[2].nametree == (ndn_nametree_t *)0x0)) && (*(long *)&pnVar6[2].capacity == 0)) {
        pnVar3 = ndn_nametree_at(self->nametree,id);
        pnVar3->pit_id = 0xffff;
        pnVar6[3].capacity = 0xffff;
        pnVar6[2].nametree = (ndn_nametree_t *)0x0;
        *(undefined8 *)&pnVar6[2].capacity = 0;
        pnVar6[1].nametree = (ndn_nametree_t *)0x0;
        *(undefined8 *)&pnVar6[1].capacity = 0;
        pnVar6->nametree = (ndn_nametree_t *)0x0;
        *(undefined8 *)&pnVar6->capacity = 0;
        pnVar6[3].nametree = (ndn_nametree_t *)0x0;
        uVar2 = (ulong)self->capacity;
      }
      uVar5 = uVar5 + 1;
      pnVar6 = pnVar6 + 5;
    } while (uVar5 < uVar2);
  }
  return;
}

Assistant:

void
ndn_pit_unregister_face(ndn_pit_t* self, ndn_table_id_t face_id){
  for (ndn_table_id_t i = 0; i < self->capacity; ++i){
    self->slots[i].incoming_faces = bitset_unset(self->slots[i].incoming_faces, face_id);
    ndn_pit_remove_entry_if_empty(self, &self->slots[i]);
  }
}